

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.cpp
# Opt level: O2

void printBinaryCode(vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> *code,
                    int bitWidth)

{
  int iVar1;
  int iVar2;
  int i;
  int iVar3;
  double dVar4;
  
  iVar2 = 0;
  iVar1 = 0;
  if (0 < bitWidth) {
    iVar1 = bitWidth;
  }
  for (; iVar2 != iVar1; iVar2 = iVar2 + 1) {
    for (iVar3 = 0; dVar4 = ldexp(1.0,bitWidth), (double)iVar3 < dVar4; iVar3 = iVar3 + 1) {
      std::ostream::_M_insert<bool>(true);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void printBinaryCode(const std::vector<std::bitset<20> >& code, int bitWidth)
{
	for(int j = 0; j < bitWidth; ++j)
	{
		for(int i = 0; i < pow(2, bitWidth); i++)
		{
		    std::cout << code[i][j];
		}
		std::cout << std::endl;
	}
	std::cout << std::endl;
}